

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# composition.cc
# Opt level: O3

bool __thiscall
tinyusdz::anon_unknown_160::LoadAsset
          (anon_unknown_160 *this,AssetResolutionResolver *resolver,string *current_working_path,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *search_paths,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::FileFormatHandler,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::FileFormatHandler>_>_>
          *fileformats,AssetPath *assetPath,Path *primPath,Layer *dst_layer,
          PrimSpec **dst_primspec_root,bool error_when_no_prims_found,
          bool error_when_asset_not_found,bool error_when_unsupported_fileformat,string *warn,
          string *err)

{
  anon_unknown_160 *this_00;
  ostringstream *poVar1;
  void *pvVar2;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  const_iterator cVar6;
  mapped_type *pmVar7;
  mapped_type *pmVar8;
  Asset *asset_out;
  Layer *layer_00;
  string *psVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  char *pcVar11;
  string *warn_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  PrimSpec *src_ps;
  string _err;
  string _warn;
  ostringstream ss_e_8;
  string resolved_path;
  string ext;
  Asset asset;
  string base_dir;
  ostringstream ss_e_6;
  Layer layer;
  string local_1e88;
  string local_1e68;
  PrimSpec *local_1e48;
  long *local_1e40 [2];
  long local_1e30 [2];
  undefined1 local_1e20 [32];
  undefined1 local_1e00 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1de0 [3];
  ios_base local_1d70 [264];
  undefined1 local_1c68 [32];
  string local_1c48;
  undefined1 local_1c28 [32];
  undefined1 local_1c08 [32];
  _Alloc_hider local_1be8;
  size_type local_1be0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1bd8;
  pointer local_1bc8;
  pointer pPStack_1bc0;
  pointer local_1bb8;
  string local_1bb0;
  undefined1 local_1b90 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b78;
  undefined1 local_1b68 [16];
  undefined1 local_1b58 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_1b40 [2];
  ios_base local_1b20 [1272];
  undefined1 local_1628 [32];
  undefined1 local_1608 [24];
  undefined1 auStack_15f0 [32];
  LayerMetas local_15d0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>_>
  local_a8;
  undefined8 local_78;
  _Alloc_hider local_70;
  size_type local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_50;
  void *pvStack_38;
  
  if (dst_layer == (Layer *)0x0) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1628);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1628,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1628,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
               ,0x55);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1628,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1628,"LoadAsset",9);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1628,"():",3);
    poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1628,0xac);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1628,"[Internal error]. `dst_layer` output arg is nullptr.",0x34);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1628,"\n",1);
    if (err != (string *)0x0) {
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::string::_M_append((char *)err,local_1b90._0_8_);
      if ((undefined1 *)local_1b90._0_8_ != local_1b90 + 0x10) {
        operator_delete((void *)local_1b90._0_8_,local_1b90._16_8_ + 1);
      }
    }
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1628);
    ::std::ios_base::~ios_base((ios_base *)&local_15d0.upAxis._metas.comment);
    return false;
  }
  local_1e68._M_dataplus._M_p = (pointer)&local_1e68.field_2;
  pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)search_paths;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1e68,fileformats,
             (long)&(assetPath->asset_path_)._M_dataplus._M_p + (long)fileformats);
  GetExtension(&local_1c48,&local_1e68);
  if (local_1e68._M_string_length == 0) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1628);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1628,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1628,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
               ,0x55);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1628,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1628,"LoadAsset",9);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1628,"():",3);
    poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1628,0xb4);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1628,
               "TODO: No assetPath but Prim path(e.g. </xform>) in references.",0x3e);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1628,"\n",1);
    if (err != (string *)0x0) {
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::string::_M_append((char *)err,local_1b90._0_8_);
      if ((undefined1 *)local_1b90._0_8_ != local_1b90 + 0x10) {
        operator_delete((void *)local_1b90._0_8_,local_1b90._16_8_ + 1);
      }
    }
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1628);
    ::std::ios_base::~ios_base((ios_base *)&local_15d0.upAxis._metas.comment);
    bVar3 = false;
    goto LAB_001b6bd1;
  }
  if ((resolver->_current_working_path)._M_dataplus._M_p != (pointer)0x0) {
    ::std::__cxx11::string::_M_assign((string *)(this + 8));
  }
  if ((pointer)current_working_path->_M_string_length != (current_working_path->_M_dataplus)._M_p) {
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(this + 0x28),
                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)current_working_path);
  }
  AssetResolutionResolver::resolve((string *)local_1c68,(AssetResolutionResolver *)this,&local_1e68)
  ;
  if (local_1c68._8_8_ == 0) {
    if (error_when_asset_not_found) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1628);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1628,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1628,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                 ,0x55);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1628,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1628,"LoadAsset",9);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1628,"():",3);
      poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1628,0xca);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      local_1de0[0]._M_dataplus._M_p = (pointer)&local_1de0[0].field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)(local_1e00 + 0x20),"Failed to resolve asset path `{}`","");
      fmt::format<std::__cxx11::string>
                ((string *)local_1b90,(fmt *)(local_1e00 + 0x20),(string *)&local_1e68,pbVar10);
      poVar5 = ::std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1628,(char *)local_1b90._0_8_,local_1b90._8_8_);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
      if ((undefined1 *)local_1b90._0_8_ != local_1b90 + 0x10) {
        operator_delete((void *)local_1b90._0_8_,local_1b90._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1de0[0]._M_dataplus._M_p != &local_1de0[0].field_2) {
        operator_delete(local_1de0[0]._M_dataplus._M_p,
                        CONCAT71(local_1de0[0].field_2._M_allocated_capacity._1_7_,
                                 local_1de0[0].field_2._M_local_buf[0]) + 1);
      }
      if (err != (string *)0x0) {
        ::std::__cxx11::stringbuf::str();
        ::std::__cxx11::string::_M_append((char *)err,local_1b90._0_8_);
        if ((undefined1 *)local_1b90._0_8_ != local_1b90 + 0x10) {
          operator_delete((void *)local_1b90._0_8_,local_1b90._16_8_ + 1);
        }
      }
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1628);
      ::std::ios_base::~ios_base((ios_base *)&local_15d0.upAxis._metas.comment);
      bVar3 = false;
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1628);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1628,"[warn]",6);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1628,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                 ,0x55);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1628,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1628,"LoadAsset",9);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1628,"():",3);
      poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1628,0xcc);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      local_1de0[0]._M_dataplus._M_p = (pointer)&local_1de0[0].field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)(local_1e00 + 0x20),"Asset not found: `{}`","");
      fmt::format<std::__cxx11::string>
                ((string *)local_1b90,(fmt *)(local_1e00 + 0x20),(string *)&local_1e68,pbVar10);
      poVar5 = ::std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1628,(char *)local_1b90._0_8_,local_1b90._8_8_);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
      if ((undefined1 *)local_1b90._0_8_ != local_1b90 + 0x10) {
        operator_delete((void *)local_1b90._0_8_,local_1b90._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1de0[0]._M_dataplus._M_p != &local_1de0[0].field_2) {
        operator_delete(local_1de0[0]._M_dataplus._M_p,
                        CONCAT71(local_1de0[0].field_2._M_allocated_capacity._1_7_,
                                 local_1de0[0].field_2._M_local_buf[0]) + 1);
      }
      if (warn != (string *)0x0) {
        ::std::__cxx11::stringbuf::str();
        ::std::__cxx11::string::_M_append((char *)warn,local_1b90._0_8_);
        if ((undefined1 *)local_1b90._0_8_ != local_1b90 + 0x10) {
          operator_delete((void *)local_1b90._0_8_,local_1b90._16_8_ + 1);
        }
      }
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1628);
      ::std::ios_base::~ios_base((ios_base *)&local_15d0.upAxis._metas.comment);
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1628);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1628,"[warn]",6);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1628,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                 ,0x55);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1628,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1628,"LoadAsset",9);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1628,"():",3);
      poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1628,0xdc);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      local_1de0[0]._M_dataplus._M_p = (pointer)&local_1de0[0].field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)(local_1e00 + 0x20),"  current working path: `{}`","");
      fmt::format<std::__cxx11::string>
                ((string *)local_1b90,(fmt *)(local_1e00 + 0x20),(string *)resolver,pbVar10);
      poVar5 = ::std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1628,(char *)local_1b90._0_8_,local_1b90._8_8_);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
      if ((undefined1 *)local_1b90._0_8_ != local_1b90 + 0x10) {
        operator_delete((void *)local_1b90._0_8_,local_1b90._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1de0[0]._M_dataplus._M_p != &local_1de0[0].field_2) {
        operator_delete(local_1de0[0]._M_dataplus._M_p,
                        CONCAT71(local_1de0[0].field_2._M_allocated_capacity._1_7_,
                                 local_1de0[0].field_2._M_local_buf[0]) + 1);
      }
      if (warn != (string *)0x0) {
        ::std::__cxx11::stringbuf::str();
        ::std::__cxx11::string::_M_append((char *)warn,local_1b90._0_8_);
        if ((undefined1 *)local_1b90._0_8_ != local_1b90 + 0x10) {
          operator_delete((void *)local_1b90._0_8_,local_1b90._16_8_ + 1);
        }
      }
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1628);
      ::std::ios_base::~ios_base((ios_base *)&local_15d0.upAxis._metas.comment);
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1628);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1628,"[warn]",6);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1628,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                 ,0x55);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1628,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1628,"LoadAsset",9);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1628,"():",3);
      poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1628,0xde);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      local_1de0[0]._M_dataplus._M_p = (pointer)&local_1de0[0].field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)(local_1e00 + 0x20),"  resolver.current_working_path: `{}`","");
      fmt::format<std::__cxx11::string>
                ((string *)local_1b90,(fmt *)(local_1e00 + 0x20),(string *)(this + 8),pbVar10);
      poVar5 = ::std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1628,(char *)local_1b90._0_8_,local_1b90._8_8_);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
      if ((undefined1 *)local_1b90._0_8_ != local_1b90 + 0x10) {
        operator_delete((void *)local_1b90._0_8_,local_1b90._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1de0[0]._M_dataplus._M_p != &local_1de0[0].field_2) {
        operator_delete(local_1de0[0]._M_dataplus._M_p,
                        CONCAT71(local_1de0[0].field_2._M_allocated_capacity._1_7_,
                                 local_1de0[0].field_2._M_local_buf[0]) + 1);
      }
      if (warn != (string *)0x0) {
        ::std::__cxx11::stringbuf::str();
        ::std::__cxx11::string::_M_append((char *)warn,local_1b90._0_8_);
        if ((undefined1 *)local_1b90._0_8_ != local_1b90 + 0x10) {
          operator_delete((void *)local_1b90._0_8_,local_1b90._16_8_ + 1);
        }
      }
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1628);
      ::std::ios_base::~ios_base((ios_base *)&local_15d0.upAxis._metas.comment);
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1628);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1628,"[warn]",6);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1628,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                 ,0x55);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1628,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1628,"LoadAsset",9);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1628,"():",3);
      poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1628,0xdf);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      local_1de0[0]._M_dataplus._M_p = (pointer)&local_1de0[0].field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)(local_1e00 + 0x20),"  search_paths: `{}`","");
      fmt::format<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                ((string *)local_1b90,(fmt *)(local_1e00 + 0x20),current_working_path,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)pbVar10);
      poVar5 = ::std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1628,(char *)local_1b90._0_8_,local_1b90._8_8_);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
      pcVar11 = local_1b90 + 0x10;
      if ((char *)local_1b90._0_8_ != pcVar11) {
        operator_delete((void *)local_1b90._0_8_,local_1b90._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1de0[0]._M_dataplus._M_p != &local_1de0[0].field_2) {
        operator_delete(local_1de0[0]._M_dataplus._M_p,
                        CONCAT71(local_1de0[0].field_2._M_allocated_capacity._1_7_,
                                 local_1de0[0].field_2._M_local_buf[0]) + 1);
      }
      if (warn != (string *)0x0) {
        ::std::__cxx11::stringbuf::str();
        ::std::__cxx11::string::_M_append((char *)warn,local_1b90._0_8_);
        if ((char *)local_1b90._0_8_ != pcVar11) {
          operator_delete((void *)local_1b90._0_8_,local_1b90._16_8_ + 1);
        }
      }
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1628);
      ::std::ios_base::~ios_base((ios_base *)&local_15d0.upAxis._metas.comment);
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1628);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1628,"[warn]",6);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1628,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                 ,0x55);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1628,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1628,"LoadAsset",9);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1628,"():",3);
      poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1628,0xe1);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      local_1de0[0]._M_dataplus._M_p = (pointer)&local_1de0[0].field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)(local_1e00 + 0x20),"  resolver.search_paths: `{}`","");
      fmt::format<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                ((string *)local_1b90,(fmt *)(local_1e00 + 0x20),(string *)(this + 0x28),
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)pbVar10);
      poVar5 = ::std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1628,(char *)local_1b90._0_8_,local_1b90._8_8_);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
      if ((char *)local_1b90._0_8_ != pcVar11) {
        operator_delete((void *)local_1b90._0_8_,local_1b90._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1de0[0]._M_dataplus._M_p != &local_1de0[0].field_2) {
        operator_delete(local_1de0[0]._M_dataplus._M_p,
                        CONCAT71(local_1de0[0].field_2._M_allocated_capacity._1_7_,
                                 local_1de0[0].field_2._M_local_buf[0]) + 1);
      }
      if (warn != (string *)0x0) {
        ::std::__cxx11::stringbuf::str();
        ::std::__cxx11::string::_M_append((char *)warn,local_1b90._0_8_);
        if ((char *)local_1b90._0_8_ != pcVar11) {
          operator_delete((void *)local_1b90._0_8_,local_1b90._16_8_ + 1);
        }
      }
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1628);
      ::std::ios_base::~ios_base((ios_base *)&local_15d0.upAxis._metas.comment);
      *dst_primspec_root = (PrimSpec *)0x0;
      bVar3 = true;
    }
  }
  else {
    this_00 = this + 0x28;
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)this_00,
                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)current_working_path);
    io::GetBaseDir(&local_1bb0,(string *)local_1c68);
    if ((optional<tinyusdz::Axis>)local_1bb0._M_string_length != (optional<tinyusdz::Axis>)0x0) {
      ::std::__cxx11::string::_M_assign((string *)(this + 8));
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)this_00,&local_1bb0);
    }
    local_1c28._0_8_ = (long)local_1c28 + 0x10;
    local_1c28._8_8_ = 0;
    local_1c28[0x10] = '\0';
    local_1c08._0_8_ = (long)local_1c08 + 0x10;
    local_1c08._8_8_ = 0;
    local_1c08[0x10] = '\0';
    local_1be8._M_p = (pointer)&local_1bd8;
    local_1be0 = 0;
    local_1bd8._M_local_buf[0] = '\0';
    local_1bc8 = (pointer)0x0;
    pPStack_1bc0 = (pointer)0x0;
    local_1bb8 = (pointer)0x0;
    asset_out = (Asset *)local_1c28;
    psVar9 = (string *)err;
    bVar3 = AssetResolutionResolver::open_asset
                      ((AssetResolutionResolver *)this,(string *)local_1c68,&local_1e68,asset_out,
                       warn,err);
    if (bVar3) {
      bVar3 = IsUSDFileFormat(&local_1e68);
      if ((bVar3) || (bVar3 = IsMtlxFileFormat(&local_1e68), bVar3)) {
        bVar3 = IsUSDFileFormat(&local_1e68);
        if ((bVar3) || (bVar3 = IsMtlxFileFormat(&local_1e68), bVar3)) goto LAB_001b5531;
        if (error_when_unsupported_fileformat) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1628);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1628,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1628,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                     ,0x55);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1628,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1628,"LoadAsset",9);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1628,"():",3);
          poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1628,0x104);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
          pcVar11 = "TODO: Unknown/unsupported asset file format: {}";
          goto LAB_001b5b81;
        }
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1628);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1628,"[warn]",6);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1628,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                   ,0x55);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1628,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1628,"LoadAsset",9);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1628,"():",3);
        poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1628,0x108);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
        pcVar11 = "TODO: Unknown/unsupported asset file format. Skipped: {}";
      }
      else {
        cVar6 = ::std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::FileFormatHandler>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::FileFormatHandler>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::FileFormatHandler>_>_>
                ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::FileFormatHandler>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::FileFormatHandler>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::FileFormatHandler>_>_>
                        *)search_paths,&local_1c48);
        asset_out = (Asset *)&(search_paths->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish;
        if ((Asset *)cVar6._M_node != asset_out) {
LAB_001b5531:
          local_1628._0_8_ = local_1628 + 0x10;
          local_1628._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          local_1628[0x10] = '\0';
          local_1608._0_8_ = auStack_15f0 + 0x18;
          local_1608._8_8_ = 1;
          local_1608._16_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          auStack_15f0._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          auStack_15f0._8_4_ = 1.0;
          auStack_15f0._16_8_ = 0;
          auStack_15f0._24_8_ = (__node_base_ptr)0x0;
          LayerMetas::LayerMetas(&local_15d0);
          local_a8._M_impl.super__Rb_tree_header._M_header._M_left =
               &local_a8._M_impl.super__Rb_tree_header._M_header;
          local_a8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          local_a8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          local_a8._M_impl.super__Rb_tree_header._M_node_count = 0;
          local_70._M_p = (pointer)&local_60;
          local_78._0_1_ = true;
          local_78._1_1_ = true;
          local_78._2_1_ = true;
          local_78._3_1_ = true;
          local_78._4_1_ = true;
          local_78._5_1_ = true;
          local_78._6_1_ = true;
          local_78._7_1_ = true;
          local_68 = 0;
          local_60._M_local_buf[0] = '\0';
          local_50.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_50.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_50.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          pvStack_38 = (void *)0x0;
          local_1e00._0_8_ = local_1e00 + 0x10;
          local_1e00._8_8_ = 0;
          local_1e00[0x10] = '\0';
          local_1e20._0_8_ = local_1e20 + 0x10;
          local_1e20._8_8_ = 0;
          local_1e20[0x10] = '\0';
          local_a8._M_impl.super__Rb_tree_header._M_header._M_right =
               local_a8._M_impl.super__Rb_tree_header._M_header._M_left;
          bVar3 = IsUSDFileFormat(&local_1e68);
          if (bVar3) {
            local_1b58._8_8_ = (long)local_1b68 + 8;
            local_1b68[0] = false;
            local_1b68._1_3_ = 0;
            local_1b68._4_4_ = (storage_t<unsigned_int>)0x0;
            local_1b58._0_8_ = (_Link_type)0x0;
            aaStack_1b40[0]._M_allocated_capacity = (pointer)0x0;
            local_1b90._0_8_ = (char *)0x4000ffffffff;
            local_1b90[8] = true;
            local_1b90._9_3_ = 0;
            local_1b90._12_4_ = (storage_t<tinyusdz::Axis>)0x0;
            local_1b90._16_8_ = 0x80000000400;
            local_1b78._M_allocated_capacity = 0x400000800;
            local_1b78._M_local_buf[8] = false;
            local_1b78._M_local_buf[9] = false;
            local_1b78._M_local_buf[10] = false;
            local_1b78._11_5_ = 0;
            local_1b68._8_8_ = 0;
            aaStack_1b40[0]._8_8_ = (pointer)0x1;
            layer_00 = (Layer *)local_1628;
            warn_00 = (string *)local_1e00;
            psVar9 = (string *)local_1e20;
            local_1b58._16_8_ = local_1b58._8_8_;
            bVar3 = LoadLayerFromMemory((uint8_t *)local_1bc8,(long)pPStack_1bc0 - (long)local_1bc8,
                                        (string *)&local_1e68,layer_00,warn_00,psVar9,
                                        (USDLoadOptions *)local_1b90);
            ::std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::FileFormatHandler>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::FileFormatHandler>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::FileFormatHandler>_>_>
            ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::FileFormatHandler>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::FileFormatHandler>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::FileFormatHandler>_>_>
                        *)local_1b68,(_Link_type)local_1b58._0_8_);
            if (!bVar3) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b90);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1b90,"[error]",7);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1b90,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                         ,0x55);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b90,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1b90,"LoadAsset",9);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b90,"():",3);
              poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1b90,0x125);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
              local_1e88._M_dataplus._M_p = (pointer)&local_1e88.field_2;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_1e88,"Failed to open `{}` as Layer: {}","");
              fmt::format<std::__cxx11::string,std::__cxx11::string>
                        ((string *)(local_1e00 + 0x20),(fmt *)&local_1e88,&local_1e68,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1e20,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         warn_00);
LAB_001b5e9e:
              poVar5 = ::std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)local_1b90,local_1de0[0]._M_dataplus._M_p,
                                  local_1de0[0]._M_string_length);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1de0[0]._M_dataplus._M_p != &local_1de0[0].field_2) {
                operator_delete(local_1de0[0]._M_dataplus._M_p,
                                CONCAT71(local_1de0[0].field_2._M_allocated_capacity._1_7_,
                                         local_1de0[0].field_2._M_local_buf[0]) + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1e88._M_dataplus._M_p != &local_1e88.field_2) {
LAB_001b5efb:
                operator_delete(local_1e88._M_dataplus._M_p,
                                local_1e88.field_2._M_allocated_capacity + 1);
              }
joined_r0x001b5878:
              if (err != (string *)0x0) {
                ::std::__cxx11::stringbuf::str();
                ::std::__cxx11::string::_M_append((char *)err,(ulong)local_1de0[0]._M_dataplus._M_p)
                ;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1de0[0]._M_dataplus._M_p != &local_1de0[0].field_2) {
                  operator_delete(local_1de0[0]._M_dataplus._M_p,
                                  CONCAT71(local_1de0[0].field_2._M_allocated_capacity._1_7_,
                                           local_1de0[0].field_2._M_local_buf[0]) + 1);
                }
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b90);
              ::std::ios_base::~ios_base(local_1b20);
              goto LAB_001b6a3b;
            }
LAB_001b56bc:
            pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      CONCAT71((int7)((ulong)layer_00 >> 8),
                               warn == (string *)0x0 || local_1e00._8_8_ == 0);
            if (warn != (string *)0x0 && local_1e00._8_8_ != 0) {
              ::std::__cxx11::string::_M_append((char *)warn,local_1e00._0_8_);
            }
            if ((anon_struct_8_0_00000001_for___align)auStack_15f0._0_8_ ==
                (anon_struct_8_0_00000001_for___align)0x0) {
              if (error_when_no_prims_found) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b90);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1b90,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1b90,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                           ,0x55);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b90,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1b90,"LoadAsset",9);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b90,"():",3);
                poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1b90,0x15a);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
                local_1e88._M_dataplus._M_p = (pointer)&local_1e88.field_2;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_1e88,"No prims in layer `{}`","");
                fmt::format<std::__cxx11::string>
                          ((string *)(local_1e00 + 0x20),(fmt *)&local_1e88,(string *)&local_1e68,
                           pbVar10);
                poVar5 = ::std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)local_1b90,local_1de0[0]._M_dataplus._M_p,
                                    local_1de0[0]._M_string_length);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1de0[0]._M_dataplus._M_p != &local_1de0[0].field_2) {
                  operator_delete(local_1de0[0]._M_dataplus._M_p,
                                  CONCAT71(local_1de0[0].field_2._M_allocated_capacity._1_7_,
                                           local_1de0[0].field_2._M_local_buf[0]) + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1e88._M_dataplus._M_p == &local_1e88.field_2) goto joined_r0x001b5878;
                goto LAB_001b5efb;
              }
              if (dst_primspec_root != (PrimSpec **)0x0) {
                *dst_primspec_root = (PrimSpec *)0x0;
              }
            }
            else {
              local_1e48 = (PrimSpec *)0x0;
              if (dst_primspec_root != (PrimSpec **)0x0) {
                local_1de0[0]._M_dataplus._M_p = (pointer)&local_1de0[0].field_2;
                local_1de0[0]._M_string_length = 0;
                local_1de0[0].field_2._M_local_buf[0] = '\0';
                if (primPath->_valid == true) {
                  ::std::__cxx11::string::_M_assign((string *)(local_1e00 + 0x20));
                }
                else {
                  if (local_15d0.defaultPrim.str_._M_string_length == 0) {
                    pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (local_1608._16_8_ + 8);
                  }
                  else {
                    pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &local_15d0.defaultPrim;
                  }
                  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_1b90,"/",pbVar10);
                  ::std::__cxx11::string::operator=
                            ((string *)(local_1e00 + 0x20),(string *)local_1b90);
                  if ((undefined1 *)local_1b90._0_8_ != local_1b90 + 0x10) {
                    operator_delete((void *)local_1b90._0_8_,local_1b90._16_8_ + 1);
                  }
                }
                local_1e88._M_dataplus._M_p = (pointer)&local_1e88.field_2;
                ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e88,"");
                Path::Path((Path *)local_1b90,(string *)(local_1e00 + 0x20),&local_1e88);
                bVar3 = Layer::find_primspec_at
                                  ((Layer *)local_1628,(Path *)local_1b90,&local_1e48,err);
                Path::~Path((Path *)local_1b90);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1e88._M_dataplus._M_p != &local_1e88.field_2) {
                  operator_delete(local_1e88._M_dataplus._M_p,
                                  local_1e88.field_2._M_allocated_capacity + 1);
                }
                if (bVar3) {
                  if (local_1e48 == (PrimSpec *)0x0) {
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b90);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1b90,"[error]",7);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1b90,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                               ,0x55);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1b90,":",1);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1b90,"LoadAsset",9);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1b90,"():",3);
                    poVar5 = (ostream *)
                             ::std::ostream::operator<<((ostringstream *)local_1b90,0x180);
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1b90,"Internal error: PrimSpec pointer is nullptr.",
                               0x2c);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1b90,"\n",1);
                  }
                  else {
                    bVar3 = PropagateAssetResolverState
                                      (0,local_1e48,(string *)(this + 8),
                                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        *)this_00);
                    if (bVar3) {
                      *dst_primspec_root = local_1e48;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_1de0[0]._M_dataplus._M_p != &local_1de0[0].field_2) {
                        operator_delete(local_1de0[0]._M_dataplus._M_p,
                                        CONCAT71(local_1de0[0].field_2._M_allocated_capacity._1_7_,
                                                 local_1de0[0].field_2._M_local_buf[0]) + 1);
                      }
                      goto LAB_001b663d;
                    }
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b90);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1b90,"[error]",7);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1b90,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                               ,0x55);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1b90,":",1);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1b90,"LoadAsset",9);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1b90,"():",3);
                    poVar5 = (ostream *)
                             ::std::ostream::operator<<((ostringstream *)local_1b90,0x187);
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1b90,
                               "Store AssetResolver state to each PrimSpec failed.\n",0x33);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1b90,"\n",1);
                  }
                  if (err != (string *)0x0) {
                    ::std::__cxx11::stringbuf::str();
                    ::std::__cxx11::string::_M_append
                              ((char *)err,(ulong)local_1e88._M_dataplus._M_p);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1e88._M_dataplus._M_p != &local_1e88.field_2) {
LAB_001b69e8:
                      operator_delete(local_1e88._M_dataplus._M_p,
                                      local_1e88.field_2._M_allocated_capacity + 1);
                    }
                  }
                }
                else {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b90);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1b90,"[error]",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1b90,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                             ,0x55);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b90,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1b90,"LoadAsset",9);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1b90,"():",3);
                  poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1b90,0x17c);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
                  local_1e40[0] = local_1e30;
                  ::std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_1e40,
                             "Failed to find PrimSpec `{}` in layer `{}`(resolved path: `{}`)","");
                  fmt::format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                            (&local_1e88,(fmt *)local_1e40,(string *)(local_1e00 + 0x20),&local_1e68
                             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_1c68,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             psVar9);
                  poVar5 = ::std::__ostream_insert<char,std::char_traits<char>>
                                     ((ostream *)local_1b90,local_1e88._M_dataplus._M_p,
                                      local_1e88._M_string_length);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1e88._M_dataplus._M_p != &local_1e88.field_2) {
                    operator_delete(local_1e88._M_dataplus._M_p,
                                    local_1e88.field_2._M_allocated_capacity + 1);
                  }
                  if (local_1e40[0] != local_1e30) {
                    operator_delete(local_1e40[0],local_1e30[0] + 1);
                  }
                  if (err != (string *)0x0) {
                    ::std::__cxx11::stringbuf::str();
                    ::std::__cxx11::string::_M_append
                              ((char *)err,(ulong)local_1e88._M_dataplus._M_p);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1e88._M_dataplus._M_p != &local_1e88.field_2) goto LAB_001b69e8;
                  }
                }
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b90);
                ::std::ios_base::~ios_base(local_1b20);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1de0[0]._M_dataplus._M_p != &local_1de0[0].field_2) {
                  operator_delete(local_1de0[0]._M_dataplus._M_p,
                                  CONCAT71(local_1de0[0].field_2._M_allocated_capacity._1_7_,
                                           local_1de0[0].field_2._M_local_buf[0]) + 1);
                }
                goto LAB_001b6a3b;
              }
LAB_001b663d:
              pvVar2 = *(void **)this;
              ::std::__cxx11::string::_M_assign((string *)&local_70);
              ::std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator=(&local_50,
                          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)this_00);
              pvStack_38 = pvVar2;
            }
            Layer::operator=(dst_layer,(Layer *)local_1628);
            bVar3 = true;
          }
          else {
            bVar3 = IsMtlxFileFormat(&local_1e68);
            if (bVar3) {
              iVar4 = ::std::__cxx11::string::compare((char *)primPath);
              if (iVar4 != 0) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b90);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1b90,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1b90,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                           ,0x55);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b90,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1b90,"LoadAsset",9);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b90,"():",3);
                poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1b90,299);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
                ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)(local_1e00 + 0x20),"Prim path must be </MaterialX>, but got: ",
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)primPath);
                poVar5 = ::std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)local_1b90,local_1de0[0]._M_dataplus._M_p,
                                    local_1de0[0]._M_string_length);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1de0[0]._M_dataplus._M_p != &local_1de0[0].field_2) {
                  operator_delete(local_1de0[0]._M_dataplus._M_p,
                                  CONCAT71(local_1de0[0].field_2._M_allocated_capacity._1_7_,
                                           local_1de0[0].field_2._M_local_buf[0]) + 1);
                }
                goto joined_r0x001b5878;
              }
              PrimSpec::PrimSpec((PrimSpec *)local_1b90);
              layer_00 = (Layer *)local_1e00;
              bVar3 = LoadMaterialXFromAsset
                                ((Asset *)local_1c28,&local_1e68,(PrimSpec *)local_1b90,
                                 (string *)layer_00,(string *)local_1e20);
              if (bVar3) {
                ::std::__cxx11::string::operator=((string *)local_1b68,"MaterialX");
                local_1de0[0]._M_dataplus._M_p = (pointer)&local_1de0[0].field_2;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)(local_1e00 + 0x20),"MaterialX","");
                pmVar8 = ::std::__detail::
                         _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                       *)local_1608,(key_type *)(local_1e00 + 0x20));
                if (pmVar8 != (PrimSpec *)local_1b90) {
                  PrimSpec::CopyFrom(pmVar8,(PrimSpec *)local_1b90);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1de0[0]._M_dataplus._M_p != &local_1de0[0].field_2) {
                  operator_delete(local_1de0[0]._M_dataplus._M_p,
                                  CONCAT71(local_1de0[0].field_2._M_allocated_capacity._1_7_,
                                           local_1de0[0].field_2._M_local_buf[0]) + 1);
                }
                PrimSpec::~PrimSpec((PrimSpec *)local_1b90);
                goto LAB_001b56bc;
              }
              poVar1 = (ostringstream *)(local_1e00 + 0x20);
              ::std::__cxx11::ostringstream::ostringstream(poVar1);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"[error]",7);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar1,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                         ,0x55);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"LoadAsset",9);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"():",3);
              poVar5 = (ostream *)::std::ostream::operator<<(poVar1,0x131);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
              local_1e40[0] = local_1e30;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_1e40,"Failed to open mtlx asset `{}`","");
              fmt::format<std::__cxx11::string>
                        ((string *)&local_1e88,(fmt *)local_1e40,(string *)&local_1e68,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         layer_00);
LAB_001b62ff:
              poVar5 = ::std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)(local_1e00 + 0x20),local_1e88._M_dataplus._M_p,
                                  local_1e88._M_string_length);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1e88._M_dataplus._M_p != &local_1e88.field_2) {
                operator_delete(local_1e88._M_dataplus._M_p,
                                local_1e88.field_2._M_allocated_capacity + 1);
              }
              if (local_1e40[0] != local_1e30) {
LAB_001b6356:
                operator_delete(local_1e40[0],local_1e30[0] + 1);
              }
            }
            else {
              cVar6 = ::std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::FileFormatHandler>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::FileFormatHandler>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::FileFormatHandler>_>_>
                      ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::FileFormatHandler>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::FileFormatHandler>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::FileFormatHandler>_>_>
                              *)search_paths,&local_1c48);
              pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &(search_paths->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish;
              if (cVar6._M_node == (_Base_ptr)pbVar10) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b90);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1b90,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1b90,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                           ,0x55);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b90,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1b90,"LoadAsset",9);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b90,"():",3);
                poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1b90,0x14a);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
                local_1e88._M_dataplus._M_p = (pointer)&local_1e88.field_2;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_1e88,"FileFormat handler not found for asset `{}`","");
                fmt::format<std::__cxx11::string>
                          ((string *)(local_1e00 + 0x20),(fmt *)&local_1e88,(string *)&local_1e68,
                           pbVar10);
                goto LAB_001b5e9e;
              }
              PrimSpec::PrimSpec((PrimSpec *)local_1b90);
              pmVar7 = ::std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::FileFormatHandler,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::FileFormatHandler>_>_>
                       ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::FileFormatHandler,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::FileFormatHandler>_>_>
                             *)search_paths,&local_1c48);
              args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       pmVar7->userdata;
              layer_00 = (Layer *)local_1e20;
              bVar3 = (*pmVar7->reader)((Asset *)local_1c28,(PrimSpec *)local_1b90,
                                        (string *)local_1e00,(string *)layer_00,args_1);
              if (!bVar3) {
                poVar1 = (ostringstream *)(local_1e00 + 0x20);
                ::std::__cxx11::ostringstream::ostringstream(poVar1);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar1,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                           ,0x55);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar1,"LoadAsset",9);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"():",3);
                poVar5 = (ostream *)::std::ostream::operator<<(poVar1,0x13e);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
                local_1e40[0] = local_1e30;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_1e40,"Failed to read asset `{}` error: {}","");
                fmt::format<std::__cxx11::string,std::__cxx11::string>
                          (&local_1e88,(fmt *)local_1e40,&local_1e68,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_1e20,args_1);
                goto LAB_001b62ff;
              }
              if (local_1b68._8_8_ != 0) {
                pmVar8 = ::std::__detail::
                         _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                       *)local_1608,(key_type *)local_1b68);
                if (pmVar8 != (PrimSpec *)local_1b90) {
                  PrimSpec::CopyFrom(pmVar8,(PrimSpec *)local_1b90);
                }
                PrimSpec::~PrimSpec((PrimSpec *)local_1b90);
                goto LAB_001b56bc;
              }
              poVar1 = (ostringstream *)(local_1e00 + 0x20);
              ::std::__cxx11::ostringstream::ostringstream(poVar1);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"[error]",7);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar1,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                         ,0x55);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"LoadAsset",9);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"():",3);
              poVar5 = (ostream *)::std::ostream::operator<<(poVar1,0x143);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
              local_1e40[0] = local_1e30;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_1e40,"PrimSpec element_name is empty. asset `{}`","");
              fmt::format<std::__cxx11::string>
                        ((string *)&local_1e88,(fmt *)local_1e40,(string *)&local_1e68,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         layer_00);
              poVar5 = ::std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)poVar1,local_1e88._M_dataplus._M_p,
                                  local_1e88._M_string_length);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1e88._M_dataplus._M_p != &local_1e88.field_2) {
                operator_delete(local_1e88._M_dataplus._M_p,
                                local_1e88.field_2._M_allocated_capacity + 1);
              }
              if (local_1e40[0] != local_1e30) goto LAB_001b6356;
            }
            if (err != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              ::std::__cxx11::string::_M_append((char *)err,(ulong)local_1e88._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1e88._M_dataplus._M_p != &local_1e88.field_2) {
                operator_delete(local_1e88._M_dataplus._M_p,
                                local_1e88.field_2._M_allocated_capacity + 1);
              }
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1e00 + 0x20));
            ::std::ios_base::~ios_base(local_1d70);
            PrimSpec::~PrimSpec((PrimSpec *)local_1b90);
LAB_001b6a3b:
            bVar3 = false;
          }
          if ((undefined1 *)local_1e20._0_8_ != local_1e20 + 0x10) {
            operator_delete((void *)local_1e20._0_8_,
                            CONCAT71(local_1e20._17_7_,local_1e20[0x10]) + 1);
          }
          if ((undefined1 *)local_1e00._0_8_ != local_1e00 + 0x10) {
            operator_delete((void *)local_1e00._0_8_,
                            CONCAT71(local_1e00._17_7_,local_1e00[0x10]) + 1);
          }
          ::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_p != &local_60) {
            operator_delete(local_70._M_p,
                            CONCAT71(local_60._M_allocated_capacity._1_7_,local_60._M_local_buf[0])
                            + 1);
          }
          ::std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>_>
          ::_M_erase(&local_a8,
                     (_Link_type)local_a8._M_impl.super__Rb_tree_header._M_header._M_parent);
          LayerMetas::~LayerMetas(&local_15d0);
          ::std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         *)local_1608);
          if ((undefined1 *)local_1628._0_8_ != local_1628 + 0x10) {
            operator_delete((void *)local_1628._0_8_,
                            CONCAT71(local_1628._17_7_,local_1628[0x10]) + 1);
          }
          goto LAB_001b6b03;
        }
        if (error_when_unsupported_fileformat) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1628);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1628,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1628,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                     ,0x55);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1628,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1628,"LoadAsset",9);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1628,"():",3);
          poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1628,0x114);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
          pcVar11 = "Unknown/unsupported asset file format: {}";
LAB_001b5b81:
          local_1de0[0]._M_dataplus._M_p = (pointer)&local_1de0[0].field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)(local_1e00 + 0x20),pcVar11,"");
          psVar9 = (string *)&local_1e68;
          goto LAB_001b4bd8;
        }
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1628);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1628,"[warn]",6);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1628,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                   ,0x55);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1628,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1628,"LoadAsset",9);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1628,"():",3);
        poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1628,0x117);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
        pcVar11 = "Unknown/unsupported asset file format. Skipped: {}";
      }
      local_1de0[0]._M_dataplus._M_p = (pointer)&local_1de0[0].field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)(local_1e00 + 0x20),pcVar11,"");
      fmt::format<std::__cxx11::string>
                ((string *)local_1b90,(fmt *)(local_1e00 + 0x20),(string *)&local_1e68,
                 &asset_out->version_);
      poVar5 = ::std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1628,(char *)local_1b90._0_8_,local_1b90._8_8_);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
      if ((undefined1 *)local_1b90._0_8_ != local_1b90 + 0x10) {
        operator_delete((void *)local_1b90._0_8_,local_1b90._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1de0[0]._M_dataplus._M_p != &local_1de0[0].field_2) {
        operator_delete(local_1de0[0]._M_dataplus._M_p,
                        CONCAT71(local_1de0[0].field_2._M_allocated_capacity._1_7_,
                                 local_1de0[0].field_2._M_local_buf[0]) + 1);
      }
      if (warn != (string *)0x0) {
        ::std::__cxx11::stringbuf::str();
        ::std::__cxx11::string::_M_append((char *)warn,local_1b90._0_8_);
        if ((undefined1 *)local_1b90._0_8_ != local_1b90 + 0x10) {
          operator_delete((void *)local_1b90._0_8_,local_1b90._16_8_ + 1);
        }
      }
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1628);
      ::std::ios_base::~ios_base((ios_base *)&local_15d0.upAxis._metas.comment);
      bVar3 = true;
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1628);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1628,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1628,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                 ,0x55);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1628,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1628,"LoadAsset",9);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1628,"():",3);
      poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1628,0xf7);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      local_1de0[0]._M_dataplus._M_p = (pointer)&local_1de0[0].field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)(local_1e00 + 0x20),"Failed to open asset `{}`.","");
      psVar9 = (string *)local_1c68;
LAB_001b4bd8:
      fmt::format<std::__cxx11::string>
                ((string *)local_1b90,(fmt *)(local_1e00 + 0x20),psVar9,&asset_out->version_);
      poVar5 = ::std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1628,(char *)local_1b90._0_8_,local_1b90._8_8_);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
      if ((undefined1 *)local_1b90._0_8_ != local_1b90 + 0x10) {
        operator_delete((void *)local_1b90._0_8_,local_1b90._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1de0[0]._M_dataplus._M_p != &local_1de0[0].field_2) {
        operator_delete(local_1de0[0]._M_dataplus._M_p,
                        CONCAT71(local_1de0[0].field_2._M_allocated_capacity._1_7_,
                                 local_1de0[0].field_2._M_local_buf[0]) + 1);
      }
      if (err != (string *)0x0) {
        ::std::__cxx11::stringbuf::str();
        ::std::__cxx11::string::_M_append((char *)err,local_1b90._0_8_);
        if ((undefined1 *)local_1b90._0_8_ != local_1b90 + 0x10) {
          operator_delete((void *)local_1b90._0_8_,local_1b90._16_8_ + 1);
        }
      }
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1628);
      ::std::ios_base::~ios_base((ios_base *)&local_15d0.upAxis._metas.comment);
      bVar3 = false;
    }
LAB_001b6b03:
    if (local_1bc8 != (pointer)0x0) {
      operator_delete(local_1bc8,(long)local_1bb8 - (long)local_1bc8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1be8._M_p != &local_1bd8) {
      operator_delete(local_1be8._M_p,
                      CONCAT71(local_1bd8._M_allocated_capacity._1_7_,local_1bd8._M_local_buf[0]) +
                      1);
    }
    if (local_1c08._0_8_ != (long)local_1c08 + 0x10) {
      operator_delete((void *)local_1c08._0_8_,CONCAT71(local_1c08._17_7_,local_1c08[0x10]) + 1);
    }
    if (local_1c28._0_8_ != (long)local_1c28 + 0x10) {
      operator_delete((void *)local_1c28._0_8_,CONCAT71(local_1c28._17_7_,local_1c28[0x10]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1bb0._M_dataplus._M_p != &local_1bb0.field_2) {
      operator_delete(local_1bb0._M_dataplus._M_p,local_1bb0.field_2._M_allocated_capacity + 1);
    }
  }
  if ((undefined1 *)local_1c68._0_8_ != local_1c68 + 0x10) {
    operator_delete((void *)local_1c68._0_8_,local_1c68._16_8_ + 1);
  }
LAB_001b6bd1:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c48._M_dataplus._M_p != &local_1c48.field_2) {
    operator_delete(local_1c48._M_dataplus._M_p,local_1c48.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e68._M_dataplus._M_p != &local_1e68.field_2) {
    operator_delete(local_1e68._M_dataplus._M_p,local_1e68.field_2._M_allocated_capacity + 1);
  }
  return bVar3;
}

Assistant:

bool LoadAsset(AssetResolutionResolver &resolver,
               const std::string &current_working_path,
               const std::vector<std::string> &search_paths,
               const std::map<std::string, FileFormatHandler> &fileformats,
               const value::AssetPath &assetPath, const Path &primPath,
               Layer *dst_layer, const PrimSpec **dst_primspec_root,
               const bool error_when_no_prims_found,
               const bool error_when_asset_not_found,
               const bool error_when_unsupported_fileformat, std::string *warn,
               std::string *err) {
  if (!dst_layer) {
    PUSH_ERROR_AND_RETURN(
        "[Internal error]. `dst_layer` output arg is nullptr.");
  }

  std::string asset_path = assetPath.GetAssetPath();
  std::string ext = GetExtension(asset_path);

  if (asset_path.empty()) {
    PUSH_ERROR_AND_RETURN(
        "TODO: No assetPath but Prim path(e.g. </xform>) in references.");
  }

  // TODO: Use std::stack to manage AssetResolutionResolver state?
  if (current_working_path.size()) {
    resolver.set_current_working_path(current_working_path);
  }

  if (search_paths.size()) {
    resolver.set_search_paths(search_paths);
  }

  // resolve path
  // TODO: Store resolved path to Reference?
  std::string resolved_path = resolver.resolve(asset_path);

  DCOUT("Loading references: " << resolved_path
                               << ", asset_path: " << asset_path);

  if (resolved_path.empty()) {
    if (error_when_asset_not_found) {
      PUSH_ERROR_AND_RETURN(
          fmt::format("Failed to resolve asset path `{}`", asset_path));
    } else {
      PUSH_WARN(fmt::format("Asset not found: `{}`", asset_path));
#if 0 // for debugging. print cwd.
#if defined(__linux__)
      char pathname[4096];
      memset(pathname, 0, 4096);
      char *pathname_p = getcwd(pathname, 4096);

      if (pathname_p == nullptr) {
        PUSH_ERROR_AND_RETURN(
            "Getting current working directory failed.");
      }

      PUSH_WARN(fmt::format("  cwd = {}", std::string(pathname_p)));
#endif
#endif
      PUSH_WARN(
          fmt::format("  current working path: `{}`", current_working_path));
      PUSH_WARN(fmt::format("  resolver.current_working_path: `{}`",
                            resolver.current_working_path()));
      PUSH_WARN(fmt::format("  search_paths: `{}`", search_paths));
      PUSH_WARN(fmt::format("  resolver.search_paths: `{}`",
                            resolver.search_paths()));
      (*dst_primspec_root) = nullptr;
      return true;
    }
  }

  resolver.set_search_paths(search_paths);

  // Use resolved asset_path's basedir for current working path.
  // Add resolved asset_path's basedir to search path.
  std::string base_dir = io::GetBaseDir(resolved_path);
  if (base_dir.size()) {
    DCOUT(fmt::format("Add `{}' to asset search path.", base_dir));

    resolver.set_current_working_path(base_dir);

    resolver.add_search_path(base_dir);
  }

  Asset asset;
  if (!resolver.open_asset(resolved_path, asset_path, &asset, warn, err)) {
    PUSH_ERROR_AND_RETURN(
        fmt::format("Failed to open asset `{}`.", resolved_path));
  }

  DCOUT("Opened resolved assst: " << resolved_path
                                  << ", asset_path: " << asset_path);

  if (IsBuiltinFileFormat(asset_path)) {
    if (IsUSDFileFormat(asset_path) || IsMtlxFileFormat(asset_path)) {
      // ok
    } else {
      // TODO: obj
      if (error_when_unsupported_fileformat) {
        PUSH_ERROR_AND_RETURN(fmt::format(
            "TODO: Unknown/unsupported asset file format: {}", asset_path));
      } else {
        PUSH_WARN(fmt::format(
            "TODO: Unknown/unsupported asset file format. Skipped: {}",
            asset_path));
        return true;
      }
    }
  } else {
    if (fileformats.count(ext)) {
      DCOUT("Fileformat handler found for: " + ext);

    } else {
      DCOUT("Unknown/unsupported fileformat: " + ext);
      if (error_when_unsupported_fileformat) {
        PUSH_ERROR_AND_RETURN(fmt::format(
            "Unknown/unsupported asset file format: {}", asset_path));
      } else {
        PUSH_WARN(fmt::format(
            "Unknown/unsupported asset file format. Skipped: {}", asset_path));
        return true;
      }
    }
  }

  Layer layer;
  std::string _warn;
  std::string _err;

  if (IsUSDFileFormat(asset_path)) {
    if (!LoadLayerFromMemory(asset.data(), asset.size(), asset_path, &layer,
                             &_warn, &_err)) {
      PUSH_ERROR_AND_RETURN(
          fmt::format("Failed to open `{}` as Layer: {}", asset_path, _err));
    }
  } else if (IsMtlxFileFormat(asset_path)) {
    // primPath must be '</MaterialX>'
    if (primPath.prim_part() != "/MaterialX") {
      PUSH_ERROR_AND_RETURN("Prim path must be </MaterialX>, but got: " +
                            primPath.prim_part());
    }

    PrimSpec ps;
    if (!LoadMaterialXFromAsset(asset, asset_path, ps, &_warn, &_err)) {
      PUSH_ERROR_AND_RETURN(
          fmt::format("Failed to open mtlx asset `{}`", asset_path));
    }

    ps.name() = "MaterialX";
    layer.primspecs()["MaterialX"] = ps;

  } else {
    if (fileformats.count(ext)) {
      PrimSpec ps;
      const FileFormatHandler &handler = fileformats.at(ext);

      if (!handler.reader(asset, ps, &_warn, &_err, handler.userdata)) {
        PUSH_ERROR_AND_RETURN(fmt::format("Failed to read asset `{}` error: {}",
                                          asset_path, _err));
      }

      if (ps.name().empty()) {
        PUSH_ERROR_AND_RETURN(fmt::format(
            "PrimSpec element_name is empty. asset `{}`", asset_path));
      }

      layer.primspecs()[ps.name()] = ps;
      DCOUT("Read asset from custom fileformat handler: " << ext);
    } else {
      PUSH_ERROR_AND_RETURN(fmt::format(
          "FileFormat handler not found for asset `{}`", asset_path));
    }
  }

  DCOUT("layer = " << print_layer(layer, 0));

  // TODO: Recursively resolve `references`

  if (_warn.size()) {
    if (warn) {
      (*warn) += _warn;
    }
  }

  if (layer.primspecs().empty()) {
    if (error_when_no_prims_found) {
      PUSH_ERROR_AND_RETURN(fmt::format("No prims in layer `{}`", asset_path));
    }

    if (dst_primspec_root) {
      (*dst_primspec_root) = nullptr;
    }

    (*dst_layer) = std::move(layer);

    return true;
  }

  const PrimSpec *src_ps{nullptr};

  if (dst_primspec_root) {
    std::string default_prim;
    if (primPath.is_valid()) {
      default_prim = primPath.prim_part();
      DCOUT("primPath = " << default_prim);
    } else {
      // Use `defaultPrim` metadatum
      if (layer.metas().defaultPrim.valid()) {
        default_prim = "/" + layer.metas().defaultPrim.str();
        DCOUT("layer.meta.defaultPrim = " << default_prim);
      } else {
        // Use the first Prim in the layer.
        default_prim = "/" + layer.primspecs().begin()->first;
        DCOUT("layer.primspecs[0].name = " << default_prim);
      }
    }

    if (!layer.find_primspec_at(Path(default_prim, ""), &src_ps, err)) {
      PUSH_ERROR_AND_RETURN(fmt::format(
          "Failed to find PrimSpec `{}` in layer `{}`(resolved path: `{}`)",
          default_prim, asset_path, resolved_path));
    }

    if (!src_ps) {
      PUSH_ERROR_AND_RETURN("Internal error: PrimSpec pointer is nullptr.");
    }

    if (!PropagateAssetResolverState(0, *const_cast<PrimSpec *>(src_ps),
                                     resolver.current_working_path(),
                                     resolver.search_paths())) {
      PUSH_ERROR_AND_RETURN(
          "Store AssetResolver state to each PrimSpec failed.\n");
    }

    (*dst_primspec_root) = src_ps;
  }

  // FIXME: This may be redundant, since assetresulution state is stored in
  // each PrimSpec.
  // TODO: Remove layer-level assetresulution state store?
  //
  // save assetresolution state for nested composition.
  layer.set_asset_resolution_state(resolver.current_working_path(),
                                   resolver.search_paths(),
                                   resolver.get_userdata());

  (*dst_layer) = std::move(layer);

  return true;
}